

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

void Gia_QbfDumpFile(Gia_Man_t *pGia,int nPars)

{
  int iVar1;
  int iVar2;
  Cnf_Dat_t *p;
  void *__s;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *vExists;
  char *pFileName;
  int iVar5;
  long lVar6;
  Vec_Int_t *p_00;
  
  __s = (void *)0x0;
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  iVar1 = p->nVars;
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  if (iVar2 != 0) {
    __s = malloc((long)iVar2 << 2);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)iVar1 * 4);
    }
  }
  pVVar3 = pGia->vCis;
  iVar2 = pVVar3->nSize;
  if (0 < iVar2) {
    piVar4 = pVVar3->pArray;
    lVar6 = 0;
    do {
      iVar5 = piVar4[lVar6];
      if (((long)iVar5 < 0) || (pGia->nObjs <= iVar5)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      if (lVar6 < nPars) {
        iVar2 = p->pVarNums[iVar5];
        if (((long)iVar2 < 0) || (iVar1 <= iVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)((long)__s + (long)iVar2 * 4) = 1;
        iVar2 = pVVar3->nSize;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  pVVar3 = (Vec_Int_t *)malloc(0x10);
  iVar5 = nPars;
  if (nPars - 1U < 0xf) {
    iVar5 = 0x10;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  pVVar3->pArray = piVar4;
  vExists = (Vec_Int_t *)malloc(0x10);
  iVar5 = iVar2 - nPars;
  if ((iVar2 - nPars) - 1U < 0xf) {
    iVar5 = 0x10;
  }
  vExists->nSize = 0;
  vExists->nCap = iVar5;
  if (iVar5 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar5 << 2);
  }
  vExists->pArray = piVar4;
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      p_00 = vExists;
      if (*(int *)((long)__s + lVar6 * 4) != 0) {
        p_00 = pVVar3;
      }
      Vec_IntPush(p_00,(int)lVar6);
      lVar6 = lVar6 + 1;
    } while (iVar1 != lVar6);
  }
  pFileName = Extra_FileNameGenericAppend(pGia->pSpec,".qdimacs");
  Cnf_DataWriteIntoFile(p,pFileName,0,pVVar3,vExists);
  Cnf_DataFree(p);
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
  }
  free(pVVar3);
  if (vExists->pArray != (int *)0x0) {
    free(vExists->pArray);
  }
  free(vExists);
  if (__s != (void *)0x0) {
    free(__s);
  }
  printf("The 2QBF formula was written into file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Gia_QbfDumpFile( Gia_Man_t * pGia, int nPars )
{
    // original problem: \exists p \forall x \exists y.  M(p,x,y)
    // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    Vec_Int_t * vVarMap, * vForAlls, * vExists;
    Gia_Obj_t * pObj;
    char * pFileName;
    int i, Entry;
    // create var map
    vVarMap = Vec_IntStart( pCnf->nVars );
    Gia_ManForEachCi( pGia, pObj, i )
        if ( i < nPars )
            Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Gia_ManCiIdToId(pGia, i)], 1 );
    // create various maps
    vForAlls = Vec_IntAlloc( nPars );
    vExists = Vec_IntAlloc( Gia_ManCiNum(pGia) - nPars );
    Vec_IntForEachEntry( vVarMap, Entry, i )
        if ( Entry )
            Vec_IntPush( vForAlls, i );
        else
            Vec_IntPush( vExists, i );
    // generate CNF
    pFileName = Extra_FileNameGenericAppend( pGia->pSpec, ".qdimacs" );
    Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vForAlls );
    Vec_IntFree( vExists );
    Vec_IntFree( vVarMap );
    printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
}